

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::HeapType::HeapType(HeapType *this,Signature sig)

{
  HeapType HVar1;
  Type info;
  undefined8 local_28;
  
  info.id = sig.params.id.id;
  local_28 = operator_new(0x50);
  *(undefined2 *)local_28 = 0;
  *(undefined4 *)(local_28 + 4) = 1;
  *(undefined8 *)(local_28 + 8) = 0;
  *(undefined8 *)(local_28 + 0x10) = 0;
  *(undefined8 *)(local_28 + 0x18) = 0;
  *(undefined8 *)(local_28 + 0x20) = 0;
  *(undefined8 *)(local_28 + 0x28) = 0;
  *(undefined4 *)(local_28 + 0x30) = 1;
  *(uintptr_t *)(local_28 + 0x38) = sig.params.id.id;
  *(uintptr_t *)(local_28 + 0x40) = sig.results.id.id;
  HVar1 = anon_unknown_0::RecGroupStore::insert((RecGroupStore *)&stack0xffffffffffffffd8,info.id);
  this->id = (uintptr_t)HVar1;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

HeapType::HeapType(Signature sig) {
  new (this)
    HeapType(globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(sig)));
}